

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O0

void NJD_load(NJD *njd,char *str)

{
  NJDNode *node_00;
  int iVar1;
  size_t sVar2;
  char *in_RSI;
  NJD *in_RDI;
  char chain_flag [1024];
  char chain_rule [1024];
  char mora_size [1024];
  char acc [1024];
  char pron [1024];
  char read [1024];
  char orig [1024];
  char cform [1024];
  char ctype [1024];
  char pos_group3 [1024];
  char pos_group2 [1024];
  char pos_group1 [1024];
  char pos [1024];
  char string [1024];
  NJDNode *node;
  int i;
  undefined4 in_stack_ffffffffffffc7b8;
  int in_stack_ffffffffffffc7bc;
  NJDNode *in_stack_ffffffffffffc7c0;
  char local_3828 [1024];
  char local_3428 [1024];
  char local_3028 [1024];
  char local_2c28 [1024];
  char local_2828 [1024];
  char local_2428 [1024];
  char local_2028 [1024];
  char local_1c28 [1024];
  char local_1828 [1024];
  char local_1428 [1024];
  char local_1028 [1024];
  char local_c28 [1024];
  char local_828 [1024];
  char local_428 [1032];
  NJDNode *local_20;
  int local_14;
  char *local_10;
  NJD *local_8;
  
  local_14 = 0;
  local_20 = (NJDNode *)0x0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar2 = strlen(in_RSI);
  if (sVar2 == 0) {
    fprintf(_stderr,"WARNING: NJD_load() in njd.c: Input string should not be empty.");
  }
  else {
    while( true ) {
      get_token_from_string(local_10,&local_14,local_428,',');
      iVar1 = get_token_from_string(local_10,&local_14,local_828,',');
      if ((((iVar1 < 1) ||
           (iVar1 = get_token_from_string(local_10,&local_14,local_c28,','), iVar1 < 1)) ||
          (iVar1 = get_token_from_string(local_10,&local_14,local_1028,','), iVar1 < 1)) ||
         (((iVar1 = get_token_from_string(local_10,&local_14,local_1428,','), iVar1 < 1 ||
           (iVar1 = get_token_from_string(local_10,&local_14,local_1828,','), iVar1 < 1)) ||
          (iVar1 = get_token_from_string(local_10,&local_14,local_1c28,','), iVar1 < 1)))) break;
      get_token_from_string(local_10,&local_14,local_2028,',');
      get_token_from_string(local_10,&local_14,local_2428,',');
      get_token_from_string(local_10,&local_14,local_2828,',');
      iVar1 = get_token_from_string(local_10,&local_14,local_2c28,'/');
      if (iVar1 < 1) {
        return;
      }
      iVar1 = get_token_from_string(local_10,&local_14,local_3028,',');
      if (iVar1 < 1) {
        return;
      }
      get_token_from_string(local_10,&local_14,local_3428,',');
      iVar1 = get_token_from_string(local_10,&local_14,local_3828,',');
      if (iVar1 < 1) {
        return;
      }
      local_20 = (NJDNode *)calloc(1,0x78);
      NJDNode_initialize(local_20);
      NJDNode_set_string(in_stack_ffffffffffffc7c0,
                         (char *)CONCAT44(in_stack_ffffffffffffc7bc,in_stack_ffffffffffffc7b8));
      NJDNode_set_pos(in_stack_ffffffffffffc7c0,
                      (char *)CONCAT44(in_stack_ffffffffffffc7bc,in_stack_ffffffffffffc7b8));
      NJDNode_set_pos_group1
                (in_stack_ffffffffffffc7c0,
                 (char *)CONCAT44(in_stack_ffffffffffffc7bc,in_stack_ffffffffffffc7b8));
      NJDNode_set_pos_group2
                (in_stack_ffffffffffffc7c0,
                 (char *)CONCAT44(in_stack_ffffffffffffc7bc,in_stack_ffffffffffffc7b8));
      NJDNode_set_pos_group3
                (in_stack_ffffffffffffc7c0,
                 (char *)CONCAT44(in_stack_ffffffffffffc7bc,in_stack_ffffffffffffc7b8));
      NJDNode_set_ctype(in_stack_ffffffffffffc7c0,
                        (char *)CONCAT44(in_stack_ffffffffffffc7bc,in_stack_ffffffffffffc7b8));
      NJDNode_set_cform(in_stack_ffffffffffffc7c0,
                        (char *)CONCAT44(in_stack_ffffffffffffc7bc,in_stack_ffffffffffffc7b8));
      NJDNode_set_orig(in_stack_ffffffffffffc7c0,
                       (char *)CONCAT44(in_stack_ffffffffffffc7bc,in_stack_ffffffffffffc7b8));
      NJDNode_set_read(in_stack_ffffffffffffc7c0,
                       (char *)CONCAT44(in_stack_ffffffffffffc7bc,in_stack_ffffffffffffc7b8));
      NJDNode_set_pron(in_stack_ffffffffffffc7c0,
                       (char *)CONCAT44(in_stack_ffffffffffffc7bc,in_stack_ffffffffffffc7b8));
      in_stack_ffffffffffffc7c0 = local_20;
      atoi(local_2c28);
      NJDNode_set_acc(in_stack_ffffffffffffc7c0,in_stack_ffffffffffffc7bc);
      atoi(local_3028);
      NJDNode_set_mora_size(in_stack_ffffffffffffc7c0,in_stack_ffffffffffffc7bc);
      NJDNode_set_chain_rule
                (in_stack_ffffffffffffc7c0,
                 (char *)CONCAT44(in_stack_ffffffffffffc7bc,in_stack_ffffffffffffc7b8));
      node_00 = local_20;
      iVar1 = atoi(local_3828);
      NJDNode_set_chain_flag(node_00,iVar1);
      NJD_push_node(local_8,local_20);
    }
  }
  return;
}

Assistant:

void NJD_load(NJD * njd, const char *str)
{
   int i = 0;
   NJDNode *node = NULL;
   char string[MAXBUFLEN];
   char pos[MAXBUFLEN];
   char pos_group1[MAXBUFLEN];
   char pos_group2[MAXBUFLEN];
   char pos_group3[MAXBUFLEN];
   char ctype[MAXBUFLEN];
   char cform[MAXBUFLEN];
   char orig[MAXBUFLEN];
   char read[MAXBUFLEN];
   char pron[MAXBUFLEN];
   char acc[MAXBUFLEN];
   char mora_size[MAXBUFLEN];
   char chain_rule[MAXBUFLEN];
   char chain_flag[MAXBUFLEN];

   if (strlen(str) < 1) {
      fprintf(stderr, "WARNING: NJD_load() in njd.c: Input string should not be empty.");
      return;
   }

   while (1) {
      get_token_from_string(str, &i, string, ',');
      if (get_token_from_string(str, &i, pos, ',') <= 0)
         break;
      if (get_token_from_string(str, &i, pos_group1, ',') <= 0)
         break;
      if (get_token_from_string(str, &i, pos_group2, ',') <= 0)
         break;
      if (get_token_from_string(str, &i, pos_group3, ',') <= 0)
         break;
      if (get_token_from_string(str, &i, ctype, ',') <= 0)
         break;
      if (get_token_from_string(str, &i, cform, ',') <= 0)
         break;
      get_token_from_string(str, &i, orig, ',');
      get_token_from_string(str, &i, read, ',');
      get_token_from_string(str, &i, pron, ',');
      if (get_token_from_string(str, &i, acc, '/') <= 0)
         break;
      if (get_token_from_string(str, &i, mora_size, ',') <= 0)
         break;
      get_token_from_string(str, &i, chain_rule, ',');
      if (get_token_from_string(str, &i, chain_flag, ',') <= 0)
         break;
      node = (NJDNode *) calloc(1, sizeof(NJDNode));
      NJDNode_initialize(node);
      NJDNode_set_string(node, string);
      NJDNode_set_pos(node, pos);
      NJDNode_set_pos_group1(node, pos_group1);
      NJDNode_set_pos_group2(node, pos_group2);
      NJDNode_set_pos_group3(node, pos_group3);
      NJDNode_set_ctype(node, ctype);
      NJDNode_set_cform(node, cform);
      NJDNode_set_orig(node, orig);
      NJDNode_set_read(node, read);
      NJDNode_set_pron(node, pron);
      NJDNode_set_acc(node, atoi(acc));
      NJDNode_set_mora_size(node, atoi(mora_size));
      NJDNode_set_chain_rule(node, chain_rule);
      NJDNode_set_chain_flag(node, atoi(chain_flag));
      NJD_push_node(njd, node);
   }
}